

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void FBehavior::StaticSerializeModuleStates(FArchive *arc)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FBehavior **ppFVar5;
  char *pcVar6;
  char *local_30;
  char *modname;
  FBehavior *pFStack_20;
  int ModSize;
  FBehavior *module;
  FArchive *pFStack_10;
  DWORD modnum;
  FArchive *arc_local;
  
  pFStack_10 = arc;
  module._4_4_ = TArray<FBehavior_*,_FBehavior_*>::Size(&StaticModules);
  FArchive::operator<<(pFStack_10,(DWORD *)((long)&module + 4));
  uVar3 = module._4_4_;
  uVar2 = TArray<FBehavior_*,_FBehavior_*>::Size(&StaticModules);
  if (uVar3 != uVar2) {
    uVar3 = TArray<FBehavior_*,_FBehavior_*>::Size(&StaticModules);
    I_Error("Level was saved with a different number of ACS modules. (Have %d, save has %d)",
            (ulong)uVar3,(ulong)module._4_4_);
  }
  for (module._4_4_ = 0; uVar3 = module._4_4_,
      uVar2 = TArray<FBehavior_*,_FBehavior_*>::Size(&StaticModules), uVar3 < uVar2;
      module._4_4_ = module._4_4_ + 1) {
    ppFVar5 = TArray<FBehavior_*,_FBehavior_*>::operator[](&StaticModules,(ulong)module._4_4_);
    pFStack_20 = *ppFVar5;
    modname._4_4_ = GetDataSize(pFStack_20);
    bVar1 = FArchive::IsStoring(pFStack_10);
    if (bVar1) {
      FArchive::WriteString(pFStack_10,pFStack_20->ModuleName);
      FArchive::operator<<(pFStack_10,(SDWORD *)((long)&modname + 4));
    }
    else {
      local_30 = (char *)0x0;
      FArchive::operator<<(pFStack_10,&local_30);
      FArchive::operator<<(pFStack_10,(SDWORD *)((long)&modname + 4));
      iVar4 = strcasecmp(local_30,pFStack_20->ModuleName);
      uVar3 = modname._4_4_;
      if (iVar4 == 0) {
        uVar2 = GetDataSize(pFStack_20);
        if (uVar3 != uVar2) {
          if (local_30 != (char *)0x0) {
            operator_delete__(local_30);
          }
          pcVar6 = pFStack_20->ModuleName;
          uVar3 = GetDataSize(pFStack_20);
          I_Error("ACS module %s has changed from what was saved. (Have %d bytes, save has %d bytes)"
                  ,pcVar6,(ulong)uVar3,(ulong)modname._4_4_);
        }
      }
      else {
        if (local_30 != (char *)0x0) {
          operator_delete__(local_30);
        }
        I_Error("Level was saved with a different set or order of ACS modules. (Have %s, save has %s)"
                ,pFStack_20->ModuleName,local_30);
      }
      if (local_30 != (char *)0x0) {
        operator_delete__(local_30);
      }
    }
    SerializeVars(pFStack_20,pFStack_10);
  }
  return;
}

Assistant:

void FBehavior::StaticSerializeModuleStates (FArchive &arc)
{
	DWORD modnum;

	modnum = StaticModules.Size();
	arc << modnum;

	if (modnum != StaticModules.Size())
	{
		I_Error("Level was saved with a different number of ACS modules. (Have %d, save has %d)", StaticModules.Size(), modnum);
	}

	for (modnum = 0; modnum < StaticModules.Size(); ++modnum)
	{
		FBehavior *module = StaticModules[modnum];
		int ModSize = module->GetDataSize();

		if (arc.IsStoring())
		{
			arc.WriteString (module->ModuleName);
			arc << ModSize;
		}
		else
		{
			char *modname = NULL;
			arc << modname;
			arc << ModSize;
			if (stricmp (modname, module->ModuleName) != 0)
			{
				delete[] modname;
				I_Error("Level was saved with a different set or order of ACS modules. (Have %s, save has %s)", module->ModuleName, modname);
			}
			else if (ModSize != module->GetDataSize())
			{
				delete[] modname;
				I_Error("ACS module %s has changed from what was saved. (Have %d bytes, save has %d bytes)", module->ModuleName, module->GetDataSize(), ModSize);
			}
			delete[] modname;
		}
		module->SerializeVars (arc);
	}
}